

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t c)

{
  ulong uVar1;
  ulong uVar2;
  ulong numBuckets;
  
  if (c < this->mNumElements) {
    c = this->mNumElements;
  }
  uVar1 = 8;
  do {
    numBuckets = uVar1;
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar2 = (numBuckets * 0x50) / 100;
    }
    else {
      uVar2 = (numBuckets / 100) * 0x50;
    }
  } while ((numBuckets != 0) && (uVar1 = numBuckets * 2, uVar2 < c));
  if (numBuckets == 0) {
    throwOverflowError(this);
  }
  rehashPowerOfTwo(this,numBuckets);
  return;
}

Assistant:

void reserve(size_t c) {
        ROBIN_HOOD_TRACE(this)
        auto const minElementsAllowed = (std::max)(c, mNumElements);
        auto newSize = InitialNumElements;
        while (calcMaxNumElementsAllowed(newSize) < minElementsAllowed && newSize != 0) {
            newSize *= 2;
        }
        if (ROBIN_HOOD_UNLIKELY(newSize == 0)) {
            throwOverflowError();
        }

        rehashPowerOfTwo(newSize);
    }